

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchWebsocket.cpp
# Opt level: O1

void sendPacket(PTR *session,char *data,size_t len)

{
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frame
  ;
  BasePacketWriter bw;
  char buff [1024];
  string *local_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  BasePacketWriter local_470;
  undefined8 local_438;
  undefined8 uStack_430;
  code *local_428;
  undefined8 uStack_420;
  char local_418 [1024];
  
  local_470._vptr_BasePacketWriter = (_func_int **)&PTR__BasePacketWriter_0010ace0;
  local_470.mBigEndian = true;
  local_470.mIsAutoMalloc = true;
  local_470.mMaxLen = 0x400;
  local_470.mPos = 0;
  local_470.mBuffer = local_418;
  local_470.mMallocBuffer = (char *)0x0;
  BasePacketWriter::writeINT8(&local_470,'{');
  BasePacketWriter::growBuffer(&local_470,8);
  if (local_470.mPos + 8 <= local_470.mMaxLen) {
    builtin_strncpy(local_470.mBuffer + local_470.mPos,"\"data\":\"",8);
    local_470.mPos = local_470.mPos + 8;
  }
  BasePacketWriter::growBuffer(&local_470,0xd);
  if (local_470.mPos + 0xd <= local_470.mMaxLen) {
    builtin_strncpy(local_470.mBuffer + local_470.mPos,"hello, world!",0xd);
    local_470.mPos = local_470.mPos + 0xd;
  }
  BasePacketWriter::writeINT8(&local_470,'\"');
  BasePacketWriter::writeINT8(&local_470,'}');
  local_480 = (string *)0x0;
  local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_478->_M_use_count = 1;
  local_478->_M_weak_count = 1;
  local_478->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010ad10;
  local_480 = (string *)(local_478 + 1);
  local_478[1]._vptr__Sp_counted_base = (_func_int **)(local_478 + 2);
  local_478[1]._M_use_count = 0;
  local_478[1]._M_weak_count = 0;
  *(undefined1 *)&local_478[2]._vptr__Sp_counted_base = 0;
  brynet::net::WebSocketFormat::wsFrameBuild
            (local_470.mBuffer,local_470.mPos,local_480,TEXT_FRAME,true,true);
  local_428 = (code *)0x0;
  uStack_420 = 0;
  local_438 = 0;
  uStack_430 = 0;
  brynet::net::HttpSession::send
            ((shared_ptr *)
             (session->super___shared_ptr<brynet::net::HttpSession,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,(function *)&local_480);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,3);
  }
  if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
  }
  local_470._vptr_BasePacketWriter = (_func_int **)&PTR__BasePacketWriter_0010ace0;
  if (local_470.mMallocBuffer != (char *)0x0) {
    free(local_470.mMallocBuffer);
  }
  return;
}

Assistant:

static void sendPacket(HttpSession::PTR session, const char* data, size_t len)
{
    char buff[1024];
    BasePacketWriter bw(buff, sizeof(buff), true, true);
    bw.writeINT8('{');
    bw.writeBuffer("\"data\":\"", 8);
    bw.writeBuffer(data, len);
    bw.writeINT8('"');
    bw.writeINT8('}');

    auto frame = std::make_shared<std::string>();
    WebSocketFormat::wsFrameBuild(bw.getData(), bw.getPos(), *frame, WebSocketFormat::WebSocketFrameType::TEXT_FRAME, true, true);
    session->send(frame);
}